

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O0

int AF_AActor_SpawnPlayerMissile
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  int iVar1;
  AActor *source;
  FTranslatedLineTarget *z_00;
  double y_00;
  double x_00;
  DAngle type_00;
  VMValue *pVVar2;
  bool bVar3;
  bool local_8e;
  bool local_8b;
  TAngle<double> local_88;
  AActor *local_80;
  AActor *misl;
  AActor *missileactor;
  int aimflags;
  bool noautoaim;
  bool nofreeaim;
  FTranslatedLineTarget *lt;
  double z;
  double y;
  double x;
  DAngle angle;
  MetaClass *type;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  TArray<VMValue,_VMValue> *defaultparam_local;
  VMValue *param_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x1ad0,
                  "int AF_AActor_SpawnPlayerMissile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  bVar3 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar3 = true, (param->field_0).field_1.atag != 1)) {
    bVar3 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (!bVar3) {
    __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x1ad0,
                  "int AF_AActor_SpawnPlayerMissile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  source = (AActor *)(param->field_0).field_1.a;
  local_8b = true;
  if (source != (AActor *)0x0) {
    local_8b = DObject::IsKindOf((DObject *)source,AActor::RegistrationInfo.MyClass);
  }
  if (local_8b == false) {
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x1ad0,
                  "int AF_AActor_SpawnPlayerMissile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if (numparam < 2) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x1ad1,
                  "int AF_AActor_SpawnPlayerMissile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  bVar3 = false;
  if ((param[1].field_0.field_3.Type == '\x03') &&
     (bVar3 = true, param[1].field_0.field_1.atag != 1)) {
    bVar3 = param[1].field_0.field_1.a == (void *)0x0;
  }
  if (bVar3) {
    angle.Degrees = *(double *)&param[1].field_0;
    local_8e = true;
    if ((PClass *)angle.Degrees != (PClass *)0x0) {
      local_8e = PClass::IsDescendantOf((PClass *)angle.Degrees,AActor::RegistrationInfo.MyClass);
    }
    if (local_8e == false) {
      __assert_fail("type == NULL || type->IsDescendantOf(RUNTIME_CLASS(AActor))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                    ,0x1ad1,
                    "int AF_AActor_SpawnPlayerMissile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    TAngle<double>::TAngle((TAngle<double> *)&x);
    if (numparam < 3) {
      pVVar2 = TArray<VMValue,_VMValue>::operator[](defaultparam,2);
      if ((pVVar2->field_0).field_3.Type != '\x01') {
        __assert_fail("(defaultparam[paramnum]).Type == REGT_FLOAT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                      ,0x1ad2,
                      "int AF_AActor_SpawnPlayerMissile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      pVVar2 = TArray<VMValue,_VMValue>::operator[](defaultparam,2);
      TAngle<double>::operator=((TAngle<double> *)&x,(pVVar2->field_0).f);
    }
    else {
      if (param[2].field_0.field_3.Type != '\x01') {
        __assert_fail("(param[paramnum]).Type == REGT_FLOAT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                      ,0x1ad2,
                      "int AF_AActor_SpawnPlayerMissile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      TAngle<double>::operator=((TAngle<double> *)&x,param[2].field_0.f);
    }
    if (numparam < 4) {
      pVVar2 = TArray<VMValue,_VMValue>::operator[](defaultparam,3);
      if ((pVVar2->field_0).field_3.Type != '\x01') {
        __assert_fail("(defaultparam[paramnum]).Type == REGT_FLOAT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                      ,0x1ad3,
                      "int AF_AActor_SpawnPlayerMissile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      pVVar2 = TArray<VMValue,_VMValue>::operator[](defaultparam,3);
      y = (pVVar2->field_0).f;
    }
    else {
      if (param[3].field_0.field_3.Type != '\x01') {
        __assert_fail("(param[paramnum]).Type == REGT_FLOAT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                      ,0x1ad3,
                      "int AF_AActor_SpawnPlayerMissile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      y = param[3].field_0.f;
    }
    if (numparam < 5) {
      pVVar2 = TArray<VMValue,_VMValue>::operator[](defaultparam,4);
      if ((pVVar2->field_0).field_3.Type != '\x01') {
        __assert_fail("(defaultparam[paramnum]).Type == REGT_FLOAT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                      ,0x1ad4,
                      "int AF_AActor_SpawnPlayerMissile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      pVVar2 = TArray<VMValue,_VMValue>::operator[](defaultparam,4);
      z = (pVVar2->field_0).f;
    }
    else {
      if (param[4].field_0.field_3.Type != '\x01') {
        __assert_fail("(param[paramnum]).Type == REGT_FLOAT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                      ,0x1ad4,
                      "int AF_AActor_SpawnPlayerMissile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      z = param[4].field_0.f;
    }
    if (numparam < 6) {
      pVVar2 = TArray<VMValue,_VMValue>::operator[](defaultparam,5);
      if ((pVVar2->field_0).field_3.Type != '\x01') {
        __assert_fail("(defaultparam[paramnum]).Type == REGT_FLOAT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                      ,0x1ad5,
                      "int AF_AActor_SpawnPlayerMissile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      pVVar2 = TArray<VMValue,_VMValue>::operator[](defaultparam,5);
      lt = (FTranslatedLineTarget *)(pVVar2->field_0).field_1.a;
    }
    else {
      if (param[5].field_0.field_3.Type != '\x01') {
        __assert_fail("(param[paramnum]).Type == REGT_FLOAT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                      ,0x1ad5,
                      "int AF_AActor_SpawnPlayerMissile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      lt = (FTranslatedLineTarget *)param[5].field_0.field_1.a;
    }
    if (numparam < 7) {
      pVVar2 = TArray<VMValue,_VMValue>::operator[](defaultparam,6);
      bVar3 = false;
      if ((pVVar2->field_0).field_3.Type == '\x03') {
        pVVar2 = TArray<VMValue,_VMValue>::operator[](defaultparam,6);
        bVar3 = (pVVar2->field_0).field_1.atag == 0;
      }
      if (!bVar3) {
        __assert_fail("(defaultparam[paramnum]).Type == REGT_POINTER && (defaultparam[paramnum]).atag == ATAG_GENERIC"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                      ,0x1ad6,
                      "int AF_AActor_SpawnPlayerMissile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      pVVar2 = TArray<VMValue,_VMValue>::operator[](defaultparam,6);
      _aimflags = (FTranslatedLineTarget *)(pVVar2->field_0).field_1.a;
    }
    else {
      bVar3 = false;
      if (param[6].field_0.field_3.Type == '\x03') {
        bVar3 = param[6].field_0.field_1.atag == 0;
      }
      if (!bVar3) {
        __assert_fail("(param[paramnum]).Type == REGT_POINTER && (param[paramnum]).atag == ATAG_GENERIC"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                      ,0x1ad6,
                      "int AF_AActor_SpawnPlayerMissile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      _aimflags = (FTranslatedLineTarget *)param[6].field_0.field_1.a;
    }
    if (numparam < 8) {
      pVVar2 = TArray<VMValue,_VMValue>::operator[](defaultparam,7);
      if ((pVVar2->field_0).field_3.Type != '\0') {
        __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                      ,0x1ad7,
                      "int AF_AActor_SpawnPlayerMissile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      pVVar2 = TArray<VMValue,_VMValue>::operator[](defaultparam,7);
      iVar1 = (pVVar2->field_0).i;
    }
    else {
      if (param[7].field_0.field_3.Type != '\0') {
        __assert_fail("(param[paramnum]).Type == REGT_INT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                      ,0x1ad7,
                      "int AF_AActor_SpawnPlayerMissile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      iVar1 = param[7].field_0.i;
    }
    missileactor._7_1_ = iVar1 != 0;
    if (numparam < 9) {
      pVVar2 = TArray<VMValue,_VMValue>::operator[](defaultparam,8);
      if ((pVVar2->field_0).field_3.Type != '\0') {
        __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                      ,0x1ad8,
                      "int AF_AActor_SpawnPlayerMissile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      pVVar2 = TArray<VMValue,_VMValue>::operator[](defaultparam,8);
      iVar1 = (pVVar2->field_0).i;
    }
    else {
      if (param[8].field_0.field_3.Type != '\0') {
        __assert_fail("(param[paramnum]).Type == REGT_INT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                      ,0x1ad8,
                      "int AF_AActor_SpawnPlayerMissile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      iVar1 = param[8].field_0.i;
    }
    missileactor._6_1_ = iVar1 != 0;
    if (numparam < 10) {
      pVVar2 = TArray<VMValue,_VMValue>::operator[](defaultparam,9);
      if ((pVVar2->field_0).field_3.Type != '\0') {
        __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                      ,0x1ad9,
                      "int AF_AActor_SpawnPlayerMissile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      pVVar2 = TArray<VMValue,_VMValue>::operator[](defaultparam,9);
      missileactor._0_4_ = (pVVar2->field_0).i;
    }
    else {
      if (param[9].field_0.field_3.Type != '\0') {
        __assert_fail("(param[paramnum]).Type == REGT_INT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                      ,0x1ad9,
                      "int AF_AActor_SpawnPlayerMissile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      missileactor._0_4_ = param[9].field_0.i;
    }
    if (numparam == 2) {
      TAngle<double>::operator=((TAngle<double> *)&x,&(source->Angles).Yaw);
    }
    type_00.Degrees = angle.Degrees;
    x_00 = y;
    y_00 = z;
    z_00 = lt;
    TAngle<double>::TAngle(&local_88,(TAngle<double> *)&x);
    local_80 = P_SpawnPlayerMissile
                         (source,x_00,y_00,(double)z_00,(PClassActor *)type_00.Degrees,&local_88,
                          _aimflags,&misl,(bool)(missileactor._7_1_ & 1),
                          (bool)(missileactor._6_1_ & 1),(int)missileactor);
    if (0 < numret) {
      VMReturn::SetPointer(ret,local_80,1);
    }
    self._4_4_ = numret;
    if (1 < numret) {
      VMReturn::SetPointer(ret + 1,misl,1);
      self._4_4_ = 2;
    }
    return self._4_4_;
  }
  __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                ,0x1ad1,
                "int AF_AActor_SpawnPlayerMissile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
               );
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, SpawnPlayerMissile)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_CLASS(type, AActor);
	PARAM_ANGLE_DEF(angle);
	PARAM_FLOAT_DEF(x);
	PARAM_FLOAT_DEF(y);
	PARAM_FLOAT_DEF(z);
	PARAM_POINTER_DEF(lt, FTranslatedLineTarget);
	PARAM_BOOL_DEF(nofreeaim);
	PARAM_BOOL_DEF(noautoaim);
	PARAM_INT_DEF(aimflags);
	AActor *missileactor;
	if (numparam == 2) angle = self->Angles.Yaw;
	AActor *misl = P_SpawnPlayerMissile(self, x, y, z, type, angle, lt, &missileactor, nofreeaim, noautoaim, aimflags);
	if (numret > 0) ret[0].SetPointer(misl, ATAG_OBJECT);
	if (numret > 1) ret[1].SetPointer(missileactor, ATAG_OBJECT), numret = 2;
	return numret;
}